

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::json_abi_v3_11_3::detail::parse_error::position_string_abi_cxx11_
                   (position_t *pos)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char (*in_stack_ffffffffffffffb8) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [10];
  string local_30 [48];
  
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffffc8);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffffc8);
  concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[10],std::__cxx11::string>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return concat(" at line ", std::to_string(pos.lines_read + 1),
                      ", column ", std::to_string(pos.chars_read_current_line));
    }